

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

LatticeComparison __thiscall
wasm::analysis::Vector<wasm::RandomLattice>::compare
          (Vector<wasm::RandomLattice> *this,Element *a,Element *b)

{
  LatticeComparison LVar1;
  size_type sVar2;
  const_reference a_00;
  const_reference b_00;
  ulong local_38;
  size_t i;
  LatticeComparison result;
  Element *b_local;
  Element *a_local;
  Vector<wasm::RandomLattice> *this_local;
  
  sVar2 = std::
          vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
          ::size(a);
  if (sVar2 != this->size) {
    __assert_fail("a.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x36,
                  "LatticeComparison wasm::analysis::Vector<wasm::RandomLattice>::compare(const Element &, const Element &) const [L = wasm::RandomLattice]"
                 );
  }
  sVar2 = std::
          vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
          ::size(b);
  if (sVar2 == this->size) {
    i._4_4_ = EQUAL;
    local_38 = 0;
    do {
      if (this->size <= local_38) {
        return i._4_4_;
      }
      a_00 = std::
             vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
             ::operator[](a,local_38);
      b_00 = std::
             vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
             ::operator[](b,local_38);
      LVar1 = RandomLattice::compare(&this->lattice,a_00,b_00);
      switch(LVar1) {
      case NO_RELATION:
        return NO_RELATION;
      case EQUAL:
        break;
      case LESS:
        if (i._4_4_ == GREATER) {
          return NO_RELATION;
        }
        i._4_4_ = LESS;
        break;
      case GREATER:
        if (i._4_4_ == LESS) {
          return NO_RELATION;
        }
        i._4_4_ = GREATER;
      }
      local_38 = local_38 + 1;
    } while( true );
  }
  __assert_fail("b.size() == size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,0x37,
                "LatticeComparison wasm::analysis::Vector<wasm::RandomLattice>::compare(const Element &, const Element &) const [L = wasm::RandomLattice]"
               );
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    assert(a.size() == size);
    assert(b.size() == size);
    auto result = EQUAL;
    for (size_t i = 0; i < size; ++i) {
      switch (lattice.compare(a[i], b[i])) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }